

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprTermOffsetInit(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iPos;
  char *pList;
  int local_3c;
  char *local_38;
  
  local_3c = 0;
  iVar3 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_38);
  iVar5 = pExpr->pPhrase->nToken;
  if (local_38 == (char *)0x0) {
    local_3c = 0;
    local_38 = (char *)0x0;
  }
  else {
    fts3GetDeltaPosition(&local_38,&local_3c);
  }
  iVar6 = 0;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  while( true ) {
    iVar5 = iVar5 + -1;
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar7) break;
    lVar2 = *(long *)((long)ctx + 0x18);
    iVar1 = *(int *)((long)ctx + 0xc);
    *(int *)((long)ctx + 0xc) = iVar1 + 1;
    lVar4 = (long)iVar1 * 0x10;
    *(int *)(lVar2 + 0xc + lVar4) = iVar5;
    *(char **)(lVar2 + lVar4) = local_38;
    *(int *)(lVar2 + 8 + lVar4) = local_3c;
  }
  return iVar3;
}

Assistant:

static int fts3ExprTermOffsetInit(Fts3Expr *pExpr, int iPhrase, void *ctx){
  TermOffsetCtx *p = (TermOffsetCtx *)ctx;
  int nTerm;                      /* Number of tokens in phrase */
  int iTerm;                      /* For looping through nTerm phrase terms */
  char *pList;                    /* Pointer to position list for phrase */
  int iPos = 0;                   /* First position in position-list */
  int rc;

  UNUSED_PARAMETER(iPhrase);
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pList);
  nTerm = pExpr->pPhrase->nToken;
  if( pList ){
    fts3GetDeltaPosition(&pList, &iPos);
    assert_fts3_nc( iPos>=0 );
  }

  for(iTerm=0; iTerm<nTerm; iTerm++){
    TermOffset *pT = &p->aTerm[p->iTerm++];
    pT->iOff = nTerm-iTerm-1;
    pT->pList = pList;
    pT->iPos = iPos;
  }

  return rc;
}